

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

bool __thiscall
draco::RAnsDecoder<20>::rans_build_look_up_table
          (RAnsDecoder<20> *this,uint32_t *token_probs,uint32_t num_symbols)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  uint in_EDX;
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint32_t j;
  uint32_t i;
  uint32_t act_prob;
  uint32_t cum_prob;
  uint local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  value_type vVar4;
  value_type vVar5;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t uVar6;
  uint32_t uVar7;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize
            ((vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  vVar4 = 0;
  local_2c = 0;
  while( true ) {
    if (in_EDX <= vVar4) {
      return local_2c == 0x100000;
    }
    uVar7 = *(uint32_t *)(in_RSI + (ulong)vVar4 * 4);
    uVar6 = local_2c;
    pvVar2 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                       ((vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)(in_RDI + 1),
                        (ulong)vVar4);
    pvVar2->prob = uVar7;
    uVar7 = uVar6;
    pvVar2 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                       ((vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)(in_RDI + 1),
                        (ulong)vVar4);
    pvVar2->cum_prob = uVar6;
    uVar1 = *(int *)(in_RSI + (ulong)vVar4 * 4) + uVar7;
    if (0x100000 < uVar1) break;
    for (; local_2c < uVar1; local_2c = local_2c + 1) {
      vVar5 = vVar4;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)local_2c);
      *pvVar3 = vVar4;
      vVar4 = vVar5;
    }
    vVar4 = vVar4 + 1;
    local_2c = uVar1;
  }
  return false;
}

Assistant:

inline bool rans_build_look_up_table(const uint32_t token_probs[],
                                       uint32_t num_symbols) {
    lut_table_.resize(rans_precision);
    probability_table_.resize(num_symbols);
    uint32_t cum_prob = 0;
    uint32_t act_prob = 0;
    for (uint32_t i = 0; i < num_symbols; ++i) {
      probability_table_[i].prob = token_probs[i];
      probability_table_[i].cum_prob = cum_prob;
      cum_prob += token_probs[i];
      if (cum_prob > rans_precision) {
        return false;
      }
      for (uint32_t j = act_prob; j < cum_prob; ++j) {
        lut_table_[j] = i;
      }
      act_prob = cum_prob;
    }
    if (cum_prob != rans_precision) {
      return false;
    }
    return true;
  }